

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyAuxRef.cpp
# Opt level: O2

void __thiscall chrono::ChBodyAuxRef::SetFrame_COG_to_REF(ChBodyAuxRef *this,ChFrame<double> *mloc)

{
  ChBodyFrame *other;
  ChFrameMoving<double> *local;
  pointer psVar1;
  shared_ptr<chrono::ChMarker> *marker;
  pointer psVar2;
  ChFrameMoving<double> cog_oldnew;
  ChFrameMoving<double> new_cog_to_abs;
  ChFrameMoving<double> tmpref_to_abs;
  ChFrameMoving<double> old_cog_to_abs;
  ChFrameMoving<double> local_508;
  ChFrameMoving<double> local_408;
  ChFrameMoving<double> local_310;
  ChFrameMoving<double> local_218;
  ChFrameMoving<double> local_120;
  
  other = &(this->super_ChBody).super_ChBodyFrame;
  ChFrameMoving<double>::ChFrameMoving(&local_120,&other->super_ChFrameMoving<double>);
  local_508.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  local_408.super_ChFrame<double>._vptr_ChFrame = (_func_int **)&DAT_3ff0000000000000;
  local_408.super_ChFrame<double>.coord.pos.m_data[2] = 0.0;
  local_508.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x0;
  local_508.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  local_408.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  local_408.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  ChFrameMoving<double>::ChFrameMoving
            (&local_218,(ChVector<double> *)&local_508,(ChQuaternion<double> *)&local_408);
  local = &this->auxref_to_cog;
  ChFrameMoving<double>::TransformLocalToParent
            (&other->super_ChFrameMoving<double>,local,&local_218);
  ChFrameMoving<double>::ChFrameMoving(&local_408,mloc);
  ChFrameMoving<double>::TransformLocalToParent
            (&local_218,&local_408,&other->super_ChFrameMoving<double>);
  ChFrameMoving<double>::ChFrameMoving(&local_408,&other->super_ChFrameMoving<double>);
  ChFrame<double>::GetInverse(&local_508.super_ChFrame<double>,mloc);
  ChFrameMoving<double>::operator=(local,&local_508.super_ChFrame<double>);
  ChFrameMoving<double>::TransformLocalToParent
            (&other->super_ChFrameMoving<double>,local,&this->auxref_to_abs);
  ChFrameMoving<double>::GetInverse(&local_310,&local_408);
  ChFrameMoving<double>::operator>>(&local_508,&local_120,&local_310);
  psVar1 = (this->super_ChBody).marklist.
           super__Vector_base<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar2 = (this->super_ChBody).marklist.
                super__Vector_base<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1) {
    ChFrameMoving<double>::ConcatenatePreTransformation
              (&((psVar2->super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                ->super_ChFrameMoving<double>,&local_508);
    ChMarker::Update((psVar2->super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,(this->super_ChBody).super_ChPhysicsItem.super_ChObj.ChTime);
  }
  return;
}

Assistant:

void ChBodyAuxRef::SetFrame_COG_to_REF(const ChFrame<>& mloc) {
    ChFrameMoving<> old_cog_to_abs = *this;

    ChFrameMoving<> tmpref_to_abs;
    this->TransformLocalToParent(this->auxref_to_cog, tmpref_to_abs);
    tmpref_to_abs.TransformLocalToParent(ChFrameMoving<>(mloc), *this);
    // or, also, using overloaded operators for frames:
    //   tmpref_to_abs = auxref_to_cog >> *this;
    //   *this         = ChFrameMoving<>(mloc) >> tmpref_to_abs;

    ChFrameMoving<> new_cog_to_abs = *this;

    auxref_to_cog = mloc.GetInverse();
    this->TransformLocalToParent(this->auxref_to_cog, this->auxref_to_abs);
    // or, also, using overloaded operators for frames:
    //   *this->auxref_to_abs = this->auxref_to_cog.GetInverse() >> this;

    // Restore marker/forces positions, keeping unchanged respect to aux ref.
    ChFrameMoving<> cog_oldnew = old_cog_to_abs >> new_cog_to_abs.GetInverse();

    for (auto& marker : marklist) {
        marker->ConcatenatePreTransformation(cog_oldnew);
        marker->Update(ChTime);
    }

    // Forces: ?? to do...
    /*
    HIER_FORCE_INIT
    while (HIER_FORCE_NOSTOP)
    {
        FORCEpointer->
        FORCEpointer->Update (mytime);

        HIER_FORCE_NEXT
    }
    */
}